

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  byte local_60;
  byte local_58;
  byte local_51;
  uint local_50;
  OPJ_UINT8 c1_1;
  int j_1;
  OPJ_UINT8 c1;
  int j;
  int c;
  OPJ_UINT8 *beyond;
  OPJ_UINT8 *pix;
  uint local_28;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  OPJ_UINT32 height_local;
  OPJ_UINT32 width_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  FILE *IN_local;
  
  pix._4_4_ = 0;
  local_28 = 0;
  beyond = pData;
  while ((pix._4_4_ < height && (iVar1 = getc((FILE *)IN), iVar1 != -1))) {
    if (iVar1 == 0) {
      uVar2 = getc((FILE *)IN);
      if (uVar2 == 0xffffffff) {
        return 1;
      }
      if (uVar2 == 0) {
        local_28 = 0;
        pix._4_4_ = pix._4_4_ + 1;
        beyond = pData + pix._4_4_ * stride;
      }
      else {
        if (uVar2 == 1) {
          return 1;
        }
        if (uVar2 == 2) {
          iVar1 = getc((FILE *)IN);
          local_28 = iVar1 + local_28;
          iVar1 = getc((FILE *)IN);
          pix._4_4_ = iVar1 + pix._4_4_;
          beyond = pData + (ulong)local_28 + (ulong)(pix._4_4_ * stride);
        }
        else {
          local_51 = 0;
          local_50 = 0;
          while( true ) {
            bVar3 = false;
            if (((int)local_50 < (int)uVar2) && (bVar3 = false, local_28 < width)) {
              bVar3 = beyond < pData + stride * height;
            }
            if (!bVar3) break;
            if ((local_50 & 1) == 0) {
              iVar1 = getc((FILE *)IN);
              local_51 = (byte)iVar1;
            }
            if ((local_50 & 1) == 0) {
              local_60 = (byte)((int)(uint)local_51 >> 4);
            }
            else {
              local_60 = local_51 & 0xf;
            }
            *beyond = local_60;
            local_50 = local_50 + 1;
            local_28 = local_28 + 1;
            beyond = beyond + 1;
          }
          if (((uVar2 & 3) == 1) || ((uVar2 & 3) == 2)) {
            getc((FILE *)IN);
          }
        }
      }
    }
    else {
      uVar2 = getc((FILE *)IN);
      j_1 = 0;
      while( true ) {
        bVar3 = false;
        if ((j_1 < iVar1) && (bVar3 = false, local_28 < width)) {
          bVar3 = beyond < pData + stride * height;
        }
        if (!bVar3) break;
        if ((j_1 & 1U) == 0) {
          local_58 = (byte)((int)(uVar2 & 0xff) >> 4);
        }
        else {
          local_58 = (byte)uVar2 & 0xf;
        }
        *beyond = local_58;
        j_1 = j_1 + 1;
        local_28 = local_28 + 1;
        beyond = beyond + 1;
      }
    }
  }
  return 1;
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            break;
        }

        if (c) { /* encoded mode */
            int j;
            OPJ_UINT8 c1 = (OPJ_UINT8)getc(IN);

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                break;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                x += (OPJ_UINT32)c;
                c = getc(IN);
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        c1 = (OPJ_UINT8)getc(IN);
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    getc(IN);
                }
            }
        }
    }  /* while(y < height) */
    return OPJ_TRUE;
}